

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::MinMaxTest_CompareReferenceAndVaryStride_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::MinMaxTest_CompareReferenceAndVaryStride_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<void(*)(unsigned_char_const*,int,unsigned_char_const*,int,int*,int*)>::
  parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x28);
  Test::Test(this_00);
  *(undefined4 *)&this_00[2]._vptr_Test = 0xbaba;
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_010ad5f8;
  this_00[1]._vptr_Test = (_func_int **)&PTR__MinMaxTest_CompareReferenceAndVaryStride_Test_010ad638
  ;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }